

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

Script * cfd::core::ScriptUtil::CreateP2wpkhLockingScript
                   (Script *__return_storage_ptr__,ByteData160 *pubkey_hash)

{
  ScriptBuilder builder;
  ScriptBuilder local_30;
  
  local_30._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
  local_30.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendOperator(&local_30,(ScriptOperator *)ScriptOperator::OP_0);
  ScriptBuilder::AppendData(&local_30,pubkey_hash);
  ScriptBuilder::Build(__return_storage_ptr__,&local_30);
  ScriptBuilder::~ScriptBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2wpkhLockingScript(const ByteData160& pubkey_hash) {
  // create script
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_0);
  builder.AppendData(pubkey_hash);

  return builder.Build();
}